

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O0

void handleLinkCOMOptions(KinDynComputations *comp,parser *cmd)

{
  bool bVar1;
  byte bVar2;
  parser *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ostream *poVar4;
  long lVar5;
  string *in_RDI;
  Position linkComWrtFrame;
  Position linkComWrtLink;
  LinkIndex linkComIndex;
  Model *model;
  Transform frame_H_link;
  string comFrameName;
  string linkComName;
  allocator<char> *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  parser *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffe08;
  string *name;
  parser *in_stack_fffffffffffffe10;
  string local_1c0 [32];
  Transform local_1a0 [48];
  undefined8 local_170;
  string *local_168;
  string local_160 [103];
  allocator<char> local_f9;
  string local_f8 [39];
  undefined1 local_d1 [33];
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [32];
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [40];
  string *local_8;
  
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  bVar1 = cmdline::parser::exist(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90
              );
    this = (parser *)
           cmdline::parser::get<std::__cxx11::string>
                     (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::__cxx11::string::string(local_68,(string *)this);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
    std::__cxx11::string::string(local_b0);
    name = (string *)local_d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90
              );
    bVar1 = cmdline::parser::exist(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string((string *)(local_d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_d1);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,
                 in_stack_fffffffffffffd90);
      pbVar3 = cmdline::parser::get<std::__cxx11::string>(this,name);
      std::__cxx11::string::operator=(local_b0,(string *)pbVar3);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator(&local_f9);
    }
    else {
      std::__cxx11::string::operator=(local_b0,local_68);
    }
    iDynTree::KinDynComputations::getRelativeTransform(local_160,local_8);
    local_168 = (string *)iDynTree::KinDynComputations::getRobotModel();
    local_170 = iDynTree::Model::getLinkIndex(local_168);
    bVar2 = iDynTree::Model::isValidLinkIndex((long)local_168);
    if ((bVar2 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Link ");
      poVar4 = std::operator<<(poVar4,local_68);
      poVar4 = std::operator<<(poVar4," not found in the model");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    lVar5 = iDynTree::KinDynComputations::getRobotModel();
    iDynTree::Model::getLink(lVar5);
    iDynTree::Link::getInertia();
    iDynTree::SpatialInertia::getCenterOfMass();
    iDynTree::Transform::operator*(local_1a0,(Position *)local_160);
    poVar4 = std::operator<<((ostream *)&std::cout,"The COM of link ");
    poVar4 = std::operator<<(poVar4,local_68);
    poVar4 = std::operator<<(poVar4," with respect to frame ");
    poVar4 = std::operator<<(poVar4,local_b0);
    poVar4 = std::operator<<(poVar4," is ");
    iDynTree::Position::toString_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_1c0);
    poVar4 = std::operator<<(poVar4," m . ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_68);
  }
  return;
}

Assistant:

void handleLinkCOMOptions(iDynTree::KinDynComputations & comp, cmdline::parser & cmd)
{
    using namespace iDynTree;

    if( !cmd.exist("link-com") )
    {
        return;
    }

    std::string linkComName = cmd.get<std::string>("link-com");

    std::string comFrameName;
    if( cmd.exist("link-com-frame") )
    {
        comFrameName = cmd.get<std::string>("link-com-frame");
    }
    else
    {
        comFrameName = linkComName;
    }

    Transform frame_H_link = comp.getRelativeTransform(comFrameName,linkComName);

    const Model & model = comp.getRobotModel();
    LinkIndex linkComIndex = model.getLinkIndex(linkComName);

    if( !model.isValidLinkIndex(linkComIndex) )
    {
        std::cerr << "Link " << linkComName << " not found in the model" <<  std::endl;
    }

    Position linkComWrtLink = comp.getRobotModel().getLink(linkComIndex)->getInertia().getCenterOfMass();

    Position linkComWrtFrame = frame_H_link*linkComWrtLink;

    std::cout << "The COM of link " << linkComName << " with respect to frame " << comFrameName
              << " is " << linkComWrtFrame.toString() << " m . " << std::endl;
}